

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O1

bool cdftocsv::getdamagebindictionary
               (vector<damagebindictionary,_std::allocator<damagebindictionary>_>
                *damagebindictionary_vec_)

{
  pointer *ppdVar1;
  iterator __position;
  OASIS_FLOAT OVar2;
  OASIS_FLOAT OVar3;
  OASIS_FLOAT OVar4;
  FILE *__stream;
  ulong uVar5;
  damagebindictionary *__ptr;
  size_t sVar6;
  damagebindictionary *__args;
  ulong __n;
  
  __stream = fopen("static/damage_bin_dict.bin","rb");
  if (__stream == (FILE *)0x0) {
    getdamagebindictionary();
  }
  else {
    fseek(__stream,0,2);
    uVar5 = ftell(__stream);
    fseek(__stream,0,0);
    uVar5 = uVar5 / 0x14;
    __n = uVar5 & 0xffffffff;
    __ptr = (damagebindictionary *)operator_new__(__n * 0x14);
    sVar6 = fread(__ptr,0x14,__n,__stream);
    if (sVar6 == __n) {
      if ((int)uVar5 != 0) {
        uVar5 = uVar5 & 0xffffffff;
        __args = __ptr;
        do {
          __position._M_current =
               (damagebindictionary_vec_->
               super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (damagebindictionary_vec_->
              super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>)._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<damagebindictionary,std::allocator<damagebindictionary>>::
            _M_realloc_insert<damagebindictionary_const&>
                      ((vector<damagebindictionary,std::allocator<damagebindictionary>> *)
                       damagebindictionary_vec_,__position,__args);
          }
          else {
            (__position._M_current)->interval_type = __args->interval_type;
            OVar2 = __args->bin_from;
            OVar3 = __args->bin_to;
            OVar4 = __args->interpolation;
            (__position._M_current)->bin_index = __args->bin_index;
            (__position._M_current)->bin_from = OVar2;
            (__position._M_current)->bin_to = OVar3;
            (__position._M_current)->interpolation = OVar4;
            ppdVar1 = &(damagebindictionary_vec_->
                       super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppdVar1 = *ppdVar1 + 1;
          }
          __args = __args + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      operator_delete__(__ptr);
      fclose(__stream);
      return true;
    }
  }
  getdamagebindictionary();
}

Assistant:

bool getdamagebindictionary(std::vector<damagebindictionary> &damagebindictionary_vec_)
	{

		FILE *fin = fopen(DAMAGE_BIN_DICT_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: Erroropening %s\n", DAMAGE_BIN_DICT_FILE);
			exit(-1);
		}
		flseek(fin, 0L, SEEK_END);
		long long sz = fltell(fin);
		flseek(fin, 0L, SEEK_SET);
		unsigned int nrec = static_cast<unsigned int> (sz / sizeof(damagebindictionary));
		damagebindictionary *s1 = new damagebindictionary[nrec];
		if (fread(s1, sizeof(damagebindictionary), nrec, fin) != nrec) {
			fprintf(stderr, "FATAL: Error reading file\n");
			exit(-1);
		}

		for (unsigned int i = 0; i < nrec; i++) {
			damagebindictionary_vec_.push_back(s1[i]);
		}
		delete[] s1;

		fclose(fin);
		return true;
	}